

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  undefined8 *in_RDX;
  char *in_RSI;
  uint32_t len;
  uint32_t *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  char *local_8;
  
  local_8 = GetVarint32Ptr((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else if (in_RSI < local_8 + in_stack_ffffffffffffffdc) {
    local_8 = (char *)0x0;
  }
  else {
    Slice::Slice((Slice *)&stack0xffffffffffffffc8,local_8,(ulong)in_stack_ffffffffffffffdc);
    *in_RDX = in_stack_ffffffffffffffc8;
    in_RDX[1] = in_stack_ffffffffffffffd0;
    local_8 = local_8 + in_stack_ffffffffffffffdc;
  }
  return local_8;
}

Assistant:

const char* GetLengthPrefixedSlice(const char* p, const char* limit,
                                   Slice* result) {
  uint32_t len;
  p = GetVarint32Ptr(p, limit, &len);
  if (p == nullptr) return nullptr;
  if (p + len > limit) return nullptr;
  *result = Slice(p, len);
  return p + len;
}